

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::CapabilityStreamNetworkAddress::connectAuthenticated(CapabilityStreamNetworkAddress *this)

{
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  CapabilityStreamNetworkAddress *this_local;
  
  this_local = this;
  connect((CapabilityStreamNetworkAddress *)&stack0xffffffffffffffe0,in_ESI,in_RDX,in_ECX);
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  then<kj::CapabilityStreamNetworkAddress::connectAuthenticated()::__0>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)this,
             (Type *)&stack0xffffffffffffffe0);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&stack0xffffffffffffffe0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> CapabilityStreamNetworkAddress::connectAuthenticated() {
  return connect().then([](Own<AsyncIoStream>&& stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}